

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

ostream_t * el::base::utils::operator<<(ostream_t *os,CommandLineArgs *c)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  int i;
  int local_14;
  
  for (local_14 = 1; local_14 < *(int *)(in_RSI + 8); local_14 = local_14 + 1) {
    poVar1 = ::std::operator<<(in_RDI,"[");
    poVar1 = ::std::operator<<(poVar1,*(char **)(*(long *)(in_RSI + 0x10) + (long)local_14 * 8));
    ::std::operator<<(poVar1,"]");
    if (local_14 < *(int *)(in_RSI + 8) + -1) {
      ::std::operator<<(in_RDI," ");
    }
  }
  return (ostream_t *)in_RDI;
}

Assistant:

base::type::ostream_t& operator<<(base::type::ostream_t& os, const CommandLineArgs& c) {
  for (int i = 1; i < c.m_argc; ++i) {
    os << ELPP_LITERAL("[") << c.m_argv[i] << ELPP_LITERAL("]");
    if (i < c.m_argc - 1) {
      os << ELPP_LITERAL(" ");
    }
  }
  return os;
}